

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QDockAreaLayoutItem * __thiscall QDockAreaLayout::item(QDockAreaLayout *this,QList<int> *path)

{
  long lVar1;
  QDockAreaLayoutItem *pQVar2;
  QList<int> *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  int index;
  QList<int> *in_stack_ffffffffffffffb0;
  QList<int> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<int>::first(in_stack_ffffffffffffffb0);
  QList<int>::mid(in_stack_ffffffffffffffe0,(qsizetype)in_RDI,(qsizetype)in_RSI);
  pQVar2 = QDockAreaLayoutInfo::item(in_RDI,in_RSI);
  QList<int>::~QList((QList<int> *)0x5783b1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutItem &QDockAreaLayout::item(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    return docks[index].item(path.mid(1));
}